

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::V0LayerParameter::SharedCtor(V0LayerParameter *this)

{
  string *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *default_value;
  V0LayerParameter *this_local;
  
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->name_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->type_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->source_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->meanfile_,psVar1);
  default_value =
       google::protobuf::internal::
       ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::get((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)_default_det_crop_mode__abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->det_crop_mode_,default_value);
  memset(&this->weight_filler_,0,0x4c);
  this->concat_dim_ = 1;
  this->biasterm_ = true;
  this->group_ = 1;
  this->stride_ = 1;
  this->dropout_ratio_ = 0.5;
  this->local_size_ = 5;
  this->alpha_ = 1.0;
  this->beta_ = 0.75;
  this->scale_ = 1.0;
  this->k_ = 1.0;
  this->det_fg_threshold_ = 0.5;
  this->det_bg_threshold_ = 0.5;
  this->det_fg_fraction_ = 0.25;
  this->_cached_size_ = 0;
  return;
}

Assistant:

void V0LayerParameter::SharedCtor() {
  name_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  type_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  source_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  meanfile_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  det_crop_mode_.UnsafeSetDefault(&V0LayerParameter::_default_det_crop_mode_.get());
  ::memset(&weight_filler_, 0, reinterpret_cast<char*>(&new_height_) -
    reinterpret_cast<char*>(&weight_filler_) + sizeof(new_height_));
  concat_dim_ = 1u;
  biasterm_ = true;
  group_ = 1u;
  stride_ = 1u;
  dropout_ratio_ = 0.5f;
  local_size_ = 5u;
  alpha_ = 1;
  beta_ = 0.75f;
  scale_ = 1;
  k_ = 1;
  det_fg_threshold_ = 0.5f;
  det_bg_threshold_ = 0.5f;
  det_fg_fraction_ = 0.25f;
  _cached_size_ = 0;
}